

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O2

int __thiscall Connection::connect(Connection *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  int iVar1;
  runtime_error *this_00;
  int *piVar2;
  char *__rhs;
  undefined4 in_register_00000034;
  allocator local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (0 < this->kMaxTimeout) {
    iVar1 = ::connect(this->forwarding_socket_,(sockaddr *)this->serveraddr_,0x10);
    this->connected = true;
    return iVar1;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10,CONCAT44(in_register_00000034,__fd));
  std::__cxx11::string::string((string *)&local_58,"connect: ",&local_59);
  piVar2 = __errno_location();
  __rhs = strerror(*piVar2);
  std::operator+(&local_38,&local_58,__rhs);
  std::runtime_error::runtime_error(this_00,(string *)&local_38);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Connection::connect() {
    int ret;
    for (int numsec = 1; numsec <= kMaxTimeout; numsec *= 2) {
        ret = ::connect(forwarding_socket_, reinterpret_cast<sockaddr *> (serveraddr_), sizeof(*serveraddr_));
        connected = true;
        return;
    }
    throw std::runtime_error(std::string("connect: ") + strerror(errno));
}